

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManPrintStats(Lf_Man_t *p,char *pTitle)

{
  int iVar1;
  abctime aVar2;
  char *pTitle_local;
  Lf_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ",pTitle);
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    printf("Edge =%9lu   ",p->pPars->Edge);
    printf("LUT =%9lu  ",p->pPars->Area + (long)p->nInverters);
    iVar1 = Vec_FltSize(&p->vSwitches);
    if (iVar1 != 0) {
      printf("Swt =%8.1f  ",p->Switches);
    }
    if (p->pPars->fUseMux7 != 0) {
      printf("Mux7 =%7lu  ",p->pPars->Mux7);
    }
    aVar2 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar2 - p->clkStart);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Lf_ManPrintStats( Lf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ",   p->pPars->Delay );
    printf( "Area =%9lu   ",    p->pPars->Area );
    printf( "Edge =%9lu   ",    p->pPars->Edge );
    printf( "LUT =%9lu  ",      p->pPars->Area+p->nInverters );
    if ( Vec_FltSize(&p->vSwitches) )
        printf( "Swt =%8.1f  ", p->Switches );
    if ( p->pPars->fUseMux7 )
        printf( "Mux7 =%7lu  ", p->pPars->Mux7 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}